

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

int __thiscall
soplex::SPxSteepPR<double>::buildBestPriceVectorLeave(SPxSteepPR<double> *this,double feastol)

{
  double viol;
  long lVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  char *pcVar5;
  int *piVar6;
  IdxElement *pIVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long in_RDI;
  double in_XMM0_Qa;
  int i_1;
  int i;
  IdxElement price;
  double *cpen;
  double *fTest;
  double x;
  int nsorted;
  int idx;
  int in_stack_00000080;
  int in_stack_00000084;
  int in_stack_00000088;
  int in_stack_0000008c;
  IdxCompare *in_stack_00000090;
  IdxElement *in_stack_00000098;
  int in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffff84;
  int local_50;
  uint local_4c;
  int local_4;
  
  SPxSolverBase<double>::fTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar3 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e653d);
  pdVar4 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e655a);
  Array<soplex::SPxPricer<double>::IdxElement>::clear
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e6570);
  IdxSet::clear((IdxSet *)(in_RDI + 0x108));
  local_4c = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8));
  uVar8 = extraout_RDX;
  while (local_4c = local_4c - 1, -1 < (int)local_4c) {
    pcVar5 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_4c,
                           (int)uVar8);
    iVar2 = (int)pcVar5;
    viol = pdVar3[iVar2];
    uVar8 = extraout_RDX_00;
    if (viol < -in_XMM0_Qa) {
      piVar6 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x868),iVar2);
      *piVar6 = 1;
      steeppr::computePrice<double>(viol,pdVar4[iVar2],in_XMM0_Qa);
      Array<soplex::SPxPricer<double>::IdxElement>::append
                ((Array<soplex::SPxPricer<double>::IdxElement> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (IdxElement *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      uVar8 = extraout_RDX_01;
    }
  }
  pIVar7 = Array<soplex::SPxPricer<double>::IdxElement>::get_const_ptr
                     ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e6689);
  *(IdxElement **)(in_RDI + 0x30) = pIVar7;
  Array<soplex::SPxPricer<double>::IdxElement>::get_ptr
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e669e);
  Array<soplex::SPxPricer<double>::IdxElement>::size
            ((Array<soplex::SPxPricer<double>::IdxElement> *)0x2e66c0);
  uVar9 = 1;
  iVar2 = SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                    (in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088,
                     in_stack_00000084,in_stack_00000080,in_stack_000000b0,this._7_1_);
  for (local_50 = 0; local_50 < iVar2; local_50 = local_50 + 1) {
    Array<soplex::SPxPricer<double>::IdxElement>::operator[]
              ((Array<soplex::SPxPricer<double>::IdxElement> *)
               CONCAT44(in_stack_ffffffffffffff84,uVar9),in_stack_ffffffffffffff7c);
    DIdxSet::addIdx((DIdxSet *)CONCAT44(in_stack_ffffffffffffff84,uVar9),in_stack_ffffffffffffff7c);
    lVar1 = *(long *)(in_RDI + 0x10);
    pIVar7 = Array<soplex::SPxPricer<double>::IdxElement>::operator[]
                       ((Array<soplex::SPxPricer<double>::IdxElement> *)
                        CONCAT44(in_stack_ffffffffffffff84,uVar9),in_stack_ffffffffffffff7c);
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)(lVar1 + 0x868),pIVar7->idx);
    *piVar6 = 2;
  }
  if (iVar2 < 1) {
    local_4 = -1;
  }
  else {
    pIVar7 = Array<soplex::SPxPricer<double>::IdxElement>::operator[]
                       ((Array<soplex::SPxPricer<double>::IdxElement> *)
                        CONCAT44(in_stack_ffffffffffffff84,uVar9),in_stack_ffffffffffffff7c);
    local_4 = pIVar7->idx;
  }
  return local_4;
}

Assistant:

int SPxSteepPR<R>::buildBestPriceVectorLeave(R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, cpen[idx], feastol);
         price.idx = idx;
         prices.append(price);
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
      return prices[0].idx;
   else
      return -1;
}